

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::DOMLSParserImpl::canSetParameter(DOMLSParserImpl *this,XMLCh *name,bool value)

{
  int iVar1;
  undefined1 uVar2;
  
  iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMCharsetOverridesXMLEncoding);
  uVar2 = 1;
  if ((((((((iVar1 != 0) &&
           (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMDisallowDoctype),
           iVar1 != 0)) &&
          (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMNamespaces), iVar1 != 0
          )) && ((iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMValidate),
                 iVar1 != 0 &&
                 (iVar1 = XMLString::compareIStringASCII
                                    (name,(XMLCh *)XMLUni::fgDOMValidateIfSchema), iVar1 != 0)))) &&
        (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMComments), iVar1 != 0))
       && (((((iVar1 = XMLString::compareIStringASCII
                                 (name,(XMLCh *)XMLUni::fgDOMDatatypeNormalization), iVar1 != 0 &&
              (iVar1 = XMLString::compareIStringASCII
                                 (name,(XMLCh *)XMLUni::fgDOMElementContentWhitespace), iVar1 != 0))
             && ((iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMEntities),
                 iVar1 != 0 &&
                 (((iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesSchema),
                   iVar1 != 0 &&
                   (iVar1 = XMLString::compareIStringASCII
                                      (name,(XMLCh *)XMLUni::fgXercesSchemaFullChecking), iVar1 != 0
                   )) && (iVar1 = XMLString::compareIStringASCII
                                            (name,(XMLCh *)XMLUni::
                                                  fgXercesIdentityConstraintChecking), iVar1 != 0)))
                 ))) &&
            ((iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesLoadExternalDTD),
             iVar1 != 0 &&
             (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesLoadSchema),
             iVar1 != 0)))) &&
           (iVar1 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesContinueAfterFatalError), iVar1 != 0)))
       ) && (((iVar1 = XMLString::compareIStringASCII
                                 (name,(XMLCh *)XMLUni::fgXercesValidationErrorAsFatal), iVar1 != 0
              && (iVar1 = XMLString::compareIStringASCII
                                    (name,(XMLCh *)XMLUni::fgXercesCacheGrammarFromParse),
                 iVar1 != 0)) &&
             ((iVar1 = XMLString::compareIStringASCII
                                 (name,(XMLCh *)XMLUni::fgXercesUseCachedGrammarInParse), iVar1 != 0
              && (((iVar1 = XMLString::compareIStringASCII
                                      (name,(XMLCh *)XMLUni::fgXercesCalculateSrcOfs), iVar1 != 0 &&
                   (iVar1 = XMLString::compareIStringASCII
                                      (name,(XMLCh *)XMLUni::fgXercesStandardUriConformant),
                   iVar1 != 0)) &&
                  (iVar1 = XMLString::compareIStringASCII
                                     (name,(XMLCh *)XMLUni::fgXercesUserAdoptsDOMDocument),
                  iVar1 != 0)))))))) &&
     (((iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesDOMHasPSVIInfo),
       iVar1 != 0 &&
       (iVar1 = XMLString::compareIStringASCII
                          (name,(XMLCh *)XMLUni::fgXercesGenerateSyntheticAnnotations), iVar1 != 0))
      && ((iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesValidateAnnotations)
          , iVar1 != 0 &&
          (((iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesIgnoreCachedDTD),
            iVar1 != 0 &&
            (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesIgnoreAnnotations)
            , iVar1 != 0)) &&
           ((iVar1 = XMLString::compareIStringASCII
                               (name,(XMLCh *)XMLUni::fgXercesDisableDefaultEntityResolution),
            iVar1 != 0 &&
            (((iVar1 = XMLString::compareIStringASCII
                                 (name,(XMLCh *)XMLUni::fgXercesSkipDTDValidation), iVar1 != 0 &&
              (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesDoXInclude),
              iVar1 != 0)) &&
             (iVar1 = XMLString::compareIStringASCII
                                (name,(XMLCh *)XMLUni::fgXercesHandleMultipleImports), iVar1 != 0)))
            ))))))))) {
    iVar1 = XMLString::compareIStringASCII
                      (name,(XMLCh *)XMLUni::fgDOMIgnoreUnknownCharacterDenormalization);
    if (((iVar1 == 0) ||
        (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMCanonicalForm),
        iVar1 == 0)) ||
       ((iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMCDATASections),
        iVar1 == 0 ||
        (((iVar1 = XMLString::compareIStringASCII
                             (name,(XMLCh *)XMLUni::fgDOMCheckCharacterNormalization), iVar1 == 0 ||
          (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMNormalizeCharacters),
          iVar1 == 0)) ||
         (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSplitCDATASections),
         iVar1 == 0)))))) {
      uVar2 = 0;
    }
    else {
      iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSupportedMediatypesOnly);
      if (iVar1 == 0) {
        uVar2 = !value;
      }
      else {
        iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMWellFormed);
        uVar2 = value;
        if ((iVar1 != 0) &&
           (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMNamespaceDeclarations)
           , iVar1 != 0)) {
          iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMInfoset);
          uVar2 = iVar1 == 0 && value;
        }
      }
    }
  }
  return (bool)uVar2;
}

Assistant:

bool DOMLSParserImpl::canSetParameter(const XMLCh* name, bool value) const
{
    if (XMLString::compareIStringASCII(name, XMLUni::fgDOMCharsetOverridesXMLEncoding) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgDOMDisallowDoctype) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgDOMNamespaces) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgDOMValidate) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgDOMValidateIfSchema) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgDOMComments) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgDOMDatatypeNormalization) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgDOMElementContentWhitespace) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgDOMEntities) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesSchema) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaFullChecking) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesIdentityConstraintChecking) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesLoadExternalDTD) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesLoadSchema) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesContinueAfterFatalError) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesValidationErrorAsFatal) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesCacheGrammarFromParse) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesUseCachedGrammarInParse) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesCalculateSrcOfs) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesStandardUriConformant) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesUserAdoptsDOMDocument) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesDOMHasPSVIInfo) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesGenerateSyntheticAnnotations) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesValidateAnnotations) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesIgnoreCachedDTD) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesIgnoreAnnotations) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesDisableDefaultEntityResolution) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesSkipDTDValidation) == 0 ||
		XMLString::compareIStringASCII(name, XMLUni::fgXercesDoXInclude) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesHandleMultipleImports) == 0)
      return true;
    else if(XMLString::compareIStringASCII(name, XMLUni::fgDOMIgnoreUnknownCharacterDenormalization) == 0 ||
            XMLString::compareIStringASCII(name, XMLUni::fgDOMCanonicalForm) == 0 ||
            XMLString::compareIStringASCII(name, XMLUni::fgDOMCDATASections) == 0 ||
            XMLString::compareIStringASCII(name, XMLUni::fgDOMCheckCharacterNormalization) == 0 ||
            XMLString::compareIStringASCII(name, XMLUni::fgDOMNormalizeCharacters) == 0 ||
            XMLString::compareIStringASCII(name, XMLUni::fgDOMSplitCDATASections) == 0)
      return false;
    else if(XMLString::compareIStringASCII(name, XMLUni::fgDOMSupportedMediatypesOnly) == 0)
      return value?false:true;
    else if(XMLString::compareIStringASCII(name, XMLUni::fgDOMWellFormed) == 0 ||
            XMLString::compareIStringASCII(name, XMLUni::fgDOMNamespaceDeclarations) == 0 ||
            XMLString::compareIStringASCII(name, XMLUni::fgDOMInfoset) == 0)
      return value?true:false;

    return false;
}